

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::Cond<tcu::Vector<float,_4>_>::doApply
          (IRet *__return_storage_ptr__,Cond<tcu::Vector<float,_4>_> *this,EvalContext *param_1,
          IArgs *iargs)

{
  Interval *pIVar1;
  long lVar2;
  IVal *pIVar3;
  IRet *pIVar4;
  byte bVar5;
  double dVar6;
  IVal IStack_78;
  
  bVar5 = 0;
  tcu::Vector<tcu::Interval,_4>::Vector(__return_storage_ptr__);
  pIVar1 = iargs->a;
  dVar6 = pIVar1->m_lo;
  if ((dVar6 <= 1.0) && (1.0 <= pIVar1->m_hi)) {
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doUnion
              (&IStack_78,__return_storage_ptr__,iargs->b);
    pIVar3 = &IStack_78;
    pIVar4 = __return_storage_ptr__;
    for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)pIVar4->m_data = *(undefined8 *)pIVar3;
      pIVar3 = (IVal *)((long)pIVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pIVar4 = (IRet *)((long)pIVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    pIVar1 = iargs->a;
    dVar6 = pIVar1->m_lo;
  }
  if ((dVar6 <= 0.0) && (0.0 <= pIVar1->m_hi)) {
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doUnion
              (&IStack_78,__return_storage_ptr__,iargs->c);
    pIVar3 = &IStack_78;
    pIVar4 = __return_storage_ptr__;
    for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)pIVar4->m_data = *(undefined8 *)pIVar3;
      pIVar3 = (IVal *)((long)pIVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pIVar4 = (IRet *)((long)pIVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}